

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test::TestBody
          (UnknownFieldSetTest_ArenaSupportWorksWithMergeFrom_Test *this)

{
  char cVar1;
  char cVar2;
  anon_union_16_2_b9f6da03_for_SooRep_0 *this_00;
  anon_union_16_2_b9f6da03_for_SooRep_0 *set;
  long lVar3;
  UnknownFieldSet lhs_stack;
  UnknownFieldSet rhs_stack;
  Arena arena;
  char local_10c [4];
  anon_union_16_2_b9f6da03_for_SooRep_0 local_108;
  long local_f0;
  anon_union_16_2_b9f6da03_for_SooRep_0 local_e8;
  ThreadSafeArena local_d8;
  
  internal::ThreadSafeArena::ThreadSafeArena(&local_d8);
  local_10c[2] = '\0';
  local_10c[3] = '\x01';
  lVar3 = 0;
  while (lVar3 != 2) {
    local_f0 = lVar3;
    cVar1 = local_10c[lVar3 + 2];
    local_10c[0] = '\0';
    local_10c[1] = '\x01';
    for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
      cVar2 = local_10c[lVar3];
      local_108.long_rep.elements_int = 0;
      local_108.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      local_e8.long_rep.elements_int = 0;
      local_e8.short_rep.field_1 = (anon_union_8_2_4f9aec01_for_ShortSooRep_1)0x0;
      this_00 = &local_108;
      if (cVar1 != '\0') {
        this_00 = (anon_union_16_2_b9f6da03_for_SooRep_0 *)
                  Arena::DoCreateMessage<google::protobuf::UnknownFieldSet>((Arena *)&local_d8);
      }
      set = &local_e8;
      if (cVar2 != '\0') {
        set = (anon_union_16_2_b9f6da03_for_SooRep_0 *)
              Arena::DoCreateMessage<google::protobuf::UnknownFieldSet>((Arena *)&local_d8);
      }
      PopulateUFS((UnknownFieldSet *)&set->long_rep);
      UnknownFieldSet::MergeFrom
                ((UnknownFieldSet *)&this_00->long_rep,(UnknownFieldSet *)&set->long_rep);
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&local_e8.long_rep);
      UnknownFieldSet::~UnknownFieldSet((UnknownFieldSet *)&local_108.long_rep);
    }
    lVar3 = local_f0 + 1;
  }
  internal::ThreadSafeArena::~ThreadSafeArena(&local_d8);
  return;
}

Assistant:

TEST_F(UnknownFieldSetTest, ArenaSupportWorksWithMergeFrom) {
  Arena arena;

  for (bool lhs_arena : {false, true}) {
    for (bool rhs_arena : {false, true}) {
      UnknownFieldSet lhs_stack, rhs_stack;
      auto& lhs =
          lhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : lhs_stack;
      auto& rhs =
          rhs_arena ? *Arena::Create<UnknownFieldSet>(&arena) : rhs_stack;
      PopulateUFS(rhs);
      lhs.MergeFrom(rhs);
    }
  }
}